

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::Constant::GetVectorComponents
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,Constant *this,ConstantManager *const_mgr)

{
  pointer *pppCVar1;
  iterator iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  long lVar6;
  long *plVar7;
  Constant *pCVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  Constant *element_null_const;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long *plVar5;
  undefined4 extraout_var_00;
  
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*this->_vptr_Constant[0x13])(this);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->type_->_vptr_Type[0xe])();
  lVar6 = CONCAT44(extraout_var_00,iVar3);
  if (lVar6 == 0) {
    __assert_fail("vector_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                  ,0x22b,
                  "std::vector<const analysis::Constant *> spvtools::opt::analysis::Constant::GetVectorComponents(analysis::ConstantManager *) const"
                 );
  }
  if (plVar5 == (long *)0x0) {
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar8 = ConstantManager::GetConstant(const_mgr,*(Type **)(lVar6 + 0x28),&local_48);
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar4 = *(uint *)(lVar6 + 0x30);
    if (uVar4 != 0) {
      uVar9 = 0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pCVar8;
      do {
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
          ::_M_realloc_insert<spvtools::opt::analysis::Constant_const*const&>
                    ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                      *)__return_storage_ptr__,iVar2,(Constant **)&local_48);
          uVar4 = *(uint *)(lVar6 + 0x30);
        }
        else {
          *iVar2._M_current =
               (Constant *)
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
          pppCVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar4);
    }
  }
  else if (*(int *)(lVar6 + 0x30) != 0) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      plVar7 = (long *)(**(code **)(*plVar5 + 0xc0))(plVar5);
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
        ::_M_realloc_insert<spvtools::opt::analysis::Constant_const*const&>
                  ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                    *)__return_storage_ptr__,iVar2,(Constant **)(*plVar7 + lVar10));
      }
      else {
        *iVar2._M_current = *(Constant **)(*plVar7 + lVar10);
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar11 < *(uint *)(lVar6 + 0x30));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const analysis::Constant*> Constant::GetVectorComponents(
    analysis::ConstantManager* const_mgr) const {
  std::vector<const analysis::Constant*> components;
  const analysis::VectorConstant* a = this->AsVectorConstant();
  const analysis::Vector* vector_type = this->type()->AsVector();
  assert(vector_type != nullptr);
  if (a != nullptr) {
    for (uint32_t i = 0; i < vector_type->element_count(); ++i) {
      components.push_back(a->GetComponents()[i]);
    }
  } else {
    const analysis::Type* element_type = vector_type->element_type();
    const analysis::Constant* element_null_const =
        const_mgr->GetConstant(element_type, {});
    for (uint32_t i = 0; i < vector_type->element_count(); ++i) {
      components.push_back(element_null_const);
    }
  }
  return components;
}